

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudioSourceVoice_Stop(FAudioSourceVoice *voice,uint32_t Flags,uint32_t OperationSet)

{
  if ((OperationSet == 0) || (voice->audio->active == '\0')) {
    if ((Flags & 0x20) == 0) {
      (voice->field_19).src.active = '\0';
    }
    else {
      (voice->field_19).src.active = '\x02';
    }
  }
  else {
    FAudio_OPERATIONSET_QueueStop(voice,Flags,OperationSet);
  }
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_Stop(
	FAudioSourceVoice *voice,
	uint32_t Flags,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueStop(
			voice,
			Flags,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	if (Flags & FAUDIO_PLAY_TAILS)
	{
		voice->src.active = 2;
	}
	else
	{
		voice->src.active = 0;
	}
	LOG_API_EXIT(voice->audio)
	return 0;
}